

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

itemstruct_t * find_nearby_item(tgestate_t *state)

{
  uint8_t A;
  uint8_t coorditers;
  uint8_t *herocoord;
  uint8_t *structcoord;
  itemstruct_t *itemstr;
  uint8_t iters;
  uint8_t radius;
  tgestate_t *state_local;
  
  radius = '\x01';
  if (state->room_index != '\0') {
    radius = '\x06';
  }
  iters = '\x10';
  itemstr = state->item_structs;
  do {
    if ((itemstr->room_and_flags & 0x80) != 0) {
      structcoord = &(itemstr->mappos).u;
      coorditers = '\x02';
      herocoord = &(state->hero_mappos).u;
      while( true ) {
        if (((int)(uint)*structcoord <= (int)((uint)*herocoord - (uint)radius)) ||
           ((uint)*herocoord + (uint)radius < (uint)*structcoord)) break;
        structcoord = structcoord + 1;
        coorditers = coorditers + 0xff;
        herocoord = herocoord + 1;
        if (coorditers == '\0') {
          return itemstr;
        }
      }
    }
    itemstr = itemstr + 1;
    iters = iters + 0xff;
  } while (iters != '\0');
  return (itemstruct_t *)0x0;
}

Assistant:

itemstruct_t *find_nearby_item(tgestate_t *state)
{
  uint8_t       radius;  /* was C */
  uint8_t       iters;   /* was B */
  itemstruct_t *itemstr; /* was HL */

  assert(state != NULL);

  /* Select a pick up radius. */
  radius = 1; /* Outdoors. */
  if (state->room_index > room_0_OUTDOORS)
    radius = 6; /* Indoors. */

  /* For all items. */
  iters   = item__LIMIT;
  itemstr = &state->item_structs[0];
  do
  {
    if (itemstr->room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
    {
      uint8_t *structcoord; /* was HL */
      uint8_t *herocoord;   /* was DE */
      uint8_t  coorditers;  /* was B */

      // FUTURE: Candidate for loop unrolling.
      structcoord = &itemstr->mappos.u;
      herocoord   = &state->hero_mappos.u;
      coorditers = 2;
      /* Range check. */
      do
      {
        uint8_t A;

        A = *herocoord++; /* get hero map position */
        if (A - radius >= *structcoord || A + radius < *structcoord)
          goto next;
        structcoord++;
      }
      while (--coorditers);

      return itemstr;
    }

next:
    itemstr++;
  }
  while (--iters);

  return NULL;
}